

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

double GetCombinedEntropy(uint32_t *X,uint32_t *Y,int length,int is_X_used,int is_Y_used,
                         int trivial_at_end)

{
  double dVar1;
  VP8LStreaks local_38;
  double local_20;
  VP8LBitEntropy bit_entropy;
  
  if (trivial_at_end != 0) {
    local_38.counts[1] = 0;
    local_38.streaks[0][0] = 0;
    local_38.streaks[1][1] = 0;
    local_38.counts[0] = 1;
    local_38.streaks[1][0] = 1;
    local_38.streaks[0][1] = length + -1;
    dVar1 = FinalHuffmanCost(&local_38);
    return dVar1;
  }
  if (is_X_used == 0) {
    X = Y;
    if (is_Y_used == 0) {
      local_38.counts[1] = 0;
      local_38.streaks[0][0] = 0;
      local_38.streaks[0][1] = 0;
      local_38.streaks[1][0] = 0;
      local_38.streaks[1][1] = 0;
      local_38.counts[0] = 1;
      local_38.streaks[0][3 < length] = length;
      VP8LBitEntropyInit(&bit_entropy);
      goto LAB_0013ea33;
    }
  }
  else if (is_Y_used != 0) {
    (*VP8LGetCombinedEntropyUnrefined)(X,Y,length,&bit_entropy,&local_38);
    goto LAB_0013ea33;
  }
  (*VP8LGetEntropyUnrefined)(X,length,&bit_entropy,&local_38);
LAB_0013ea33:
  local_20 = BitsEntropyRefine(&bit_entropy);
  dVar1 = FinalHuffmanCost(&local_38);
  return dVar1 + local_20;
}

Assistant:

static WEBP_INLINE double GetCombinedEntropy(const uint32_t* const X,
                                             const uint32_t* const Y,
                                             int length, int is_X_used,
                                             int is_Y_used,
                                             int trivial_at_end) {
  VP8LStreaks stats;
  if (trivial_at_end) {
    // This configuration is due to palettization that transforms an indexed
    // pixel into 0xff000000 | (pixel << 8) in VP8LBundleColorMap.
    // BitsEntropyRefine is 0 for histograms with only one non-zero value.
    // Only FinalHuffmanCost needs to be evaluated.
    memset(&stats, 0, sizeof(stats));
    // Deal with the non-zero value at index 0 or length-1.
    stats.streaks[1][0] = 1;
    // Deal with the following/previous zero streak.
    stats.counts[0] = 1;
    stats.streaks[0][1] = length - 1;
    return FinalHuffmanCost(&stats);
  } else {
    VP8LBitEntropy bit_entropy;
    if (is_X_used) {
      if (is_Y_used) {
        VP8LGetCombinedEntropyUnrefined(X, Y, length, &bit_entropy, &stats);
      } else {
        VP8LGetEntropyUnrefined(X, length, &bit_entropy, &stats);
      }
    } else {
      if (is_Y_used) {
        VP8LGetEntropyUnrefined(Y, length, &bit_entropy, &stats);
      } else {
        memset(&stats, 0, sizeof(stats));
        stats.counts[0] = 1;
        stats.streaks[0][length > 3] = length;
        VP8LBitEntropyInit(&bit_entropy);
      }
    }

    return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
  }
}